

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFStream.cpp
# Opt level: O3

void __thiscall PDFStream::FlushStreamContentForDirectExtentStream(PDFStream *this)

{
  OutputStreamTraits streamCopier;
  InputStringBufferStream inputStreamForWrite;
  OutputStreamTraits OStack_48;
  InputStringBufferStream local_40;
  long *local_30;
  long local_20 [2];
  
  (**(code **)(*(long *)&this->mTemporaryStream + 0x20))(&this->mTemporaryStream,0,0,0x18);
  InputStringBufferStream::InputStringBufferStream(&local_40,&this->mTemporaryStream);
  OutputStreamTraits::OutputStreamTraits(&OStack_48,&this->mOutputStream->super_IByteWriter);
  OutputStreamTraits::CopyToOutputStream(&OStack_48,(IByteReader *)&local_40);
  std::__cxx11::stringbuf::str();
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  this->mOutputStream = (IByteWriterWithPosition *)0x0;
  OutputStreamTraits::~OutputStreamTraits(&OStack_48);
  InputStringBufferStream::~InputStringBufferStream(&local_40);
  return;
}

Assistant:

void PDFStream::FlushStreamContentForDirectExtentStream()
{
    mTemporaryStream.pubseekoff(0,std::ios_base::beg);
    
    // copy internal temporary stream to output
    InputStringBufferStream inputStreamForWrite(&mTemporaryStream);
    OutputStreamTraits streamCopier(mOutputStream);
    streamCopier.CopyToOutputStream(&inputStreamForWrite);
    
    mTemporaryStream.str();
    mOutputStream = NULL;
}